

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O0

void testXDR(string *tempdir)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  float fVar4;
  float v32f;
  uint64_t v64buf [2];
  uint32_t v32buf [2];
  uint16_t v16buf [5];
  uint8_t v8buf [5];
  uint16_t v16;
  uint32_t v32;
  uint64_t v64;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  float line;
  char *file;
  char *expr;
  
  file = (char *)0xaa00bb11cc22dd33;
  expr = (char *)0xee44ff5500661177;
  line = 42.0;
  one_from_native64(0x14ecef);
  uVar3 = one_to_native64(0x14ecf7);
  if (uVar3 != 0x123456789abcdef0) {
    core_test_fail(expr,file,(uint)line,
                   (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  one_from_native32(0);
  uVar2 = one_to_native32(0);
  if (uVar2 != 0x12345678) {
    core_test_fail(expr,file,(uint)line,
                   (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  one_from_native16(0);
  uVar1 = one_to_native16(0);
  if (uVar1 != 0x1234) {
    core_test_fail(expr,file,(uint)line,
                   (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  priv_from_native((void *)CONCAT44(line,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,
                   0x14eda9);
  priv_to_native((void *)CONCAT44(line,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,0x14edbd
                );
  priv_from_native((void *)CONCAT44(line,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,
                   0x14edfe);
  priv_to_native((void *)CONCAT44(line,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,0x14ee12
                );
  priv_from_native((void *)CONCAT44(line,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,
                   0x14ee53);
  priv_to_native((void *)CONCAT44(line,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,0x14ee67
                );
  priv_from_native((void *)CONCAT44(line,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,
                   0x14eea6);
  priv_to_native((void *)CONCAT44(line,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,0x14eeba
                );
  if (file != (char *)0xaa00bb11cc22dd33) {
    core_test_fail(expr,file,(uint)line,
                   (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  one_from_native_float(0.0);
  fVar4 = one_to_native_float(0.0);
  if ((fVar4 != line) || (NAN(fVar4) || NAN(line))) {
    core_test_fail(expr,file,(uint)line,
                   (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  return;
}

Assistant:

void
testXDR (const std::string& tempdir)
{
    uint64_t v64 = 0x123456789ABCDEF0;
    uint32_t v32 = 0x12345678;
    uint16_t v16 = 0x1234;
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
    uint64_t ov64 = 0xF0DEBC9A78563412;
    uint32_t ov32 = 0x78563412;
    uint16_t ov16 = 0x3412;
#endif
    uint8_t  v8buf[]  = {0xAA, 0xBB, 0xCC, 0xDD, 0xEE};
    uint16_t v16buf[] = {0xAA00, 0xBB11, 0xCC22, 0xDD33, 0xEE44};
    uint32_t v32buf[] = {0xAA00BB11, 0xCC22DD33};
    uint64_t v64buf[] = {0xAA00BB11CC22DD33, 0xEE44FF5500661177};
    float    v32f     = 42.f;
    EXRCORE_TEST (one_to_native64 (one_from_native64 (v64)) == v64);
    EXRCORE_TEST (one_to_native32 (one_from_native32 (v32)) == v32);
    EXRCORE_TEST (one_to_native16 (one_from_native16 (v16)) == v16);
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
    EXRCORE_TEST (one_to_native64 (v64) == ov64);
    EXRCORE_TEST (one_to_native32 (v32) == ov32);
    EXRCORE_TEST (one_to_native16 (v16) == ov16);
#endif
    priv_from_native (v8buf, 5, sizeof (uint8_t));
    priv_to_native (v8buf, 5, sizeof (uint8_t));
    EXRCORE_TEST (v8buf[2] == 0xCC);
    priv_from_native (v16buf, 5, sizeof (uint16_t));
    priv_to_native (v16buf, 5, sizeof (uint16_t));
    EXRCORE_TEST (v16buf[2] == 0xCC22);
    priv_from_native (v32buf, 2, sizeof (uint32_t));
    priv_to_native (v32buf, 2, sizeof (uint32_t));
    EXRCORE_TEST (v32buf[1] == 0xCC22DD33);
    priv_from_native (v64buf, 2, sizeof (uint64_t));
    priv_to_native (v64buf, 2, sizeof (uint64_t));
    EXRCORE_TEST (v64buf[0] == 0xAA00BB11CC22DD33);

    EXRCORE_TEST (one_to_native_float (one_from_native_float (v32f)) == v32f);
}